

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_map.cpp
# Opt level: O0

void __thiscall CDoodadsMapper::AnalyzeGameLayer(CDoodadsMapper *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  array<int,_allocator_default<int>_> *paVar7;
  long in_RDI;
  long in_FS_OFFSET;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int CheckIndex_1;
  CTile *pTile_1;
  int y_1;
  int x_1;
  int LWallChainID;
  int RWallChainID;
  bool LWallKeepChaining;
  bool RWallKeepChaining;
  int CheckIndex;
  CTile *pTile;
  int x;
  int y;
  int CeilingChainID;
  int FloorChainID;
  bool CeilingKeepChaining;
  bool FloorKeepChaining;
  CLayerGame *pLayer;
  array<int,_allocator_default<int>_> aChain_3;
  array<int,_allocator_default<int>_> aChain_2;
  array<int,_allocator_default<int>_> aChain_1;
  array<int,_allocator_default<int>_> aChain;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
  *in_stack_fffffffffffffec0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
  ::clear(in_stack_fffffffffffffec0);
  array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
  ::clear(in_stack_fffffffffffffec0);
  array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
  ::clear(in_stack_fffffffffffffec0);
  array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
  ::clear(in_stack_fffffffffffffec0);
  lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x1420);
  local_80 = 0;
  local_84 = 0;
  for (local_88 = 1; local_88 < *(int *)(lVar2 + 0x38) + -1; local_88 = local_88 + 1) {
    bVar3 = false;
    bVar4 = false;
    for (local_8c = 1; local_8c < *(int *)(lVar2 + 0x34) + -1; local_8c = local_8c + 1) {
      pcVar6 = (char *)(*(long *)(lVar2 + 0x68) +
                       (long)(local_88 * *(int *)(lVar2 + 0x34) + local_8c) * 4);
      if (*pcVar6 == '\0') {
        bVar3 = false;
        bVar4 = false;
      }
      else {
        iVar5 = (local_88 + -1) * *(int *)(lVar2 + 0x34) + local_8c;
        if ((*pcVar6 == '\x01') &&
           ((*(char *)(*(long *)(lVar2 + 0x68) + (long)iVar5 * 4) == '\0' ||
            (0xbf < *(byte *)(*(long *)(lVar2 + 0x68) + (long)iVar5 * 4))))) {
          if (bVar3) {
            array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
            ::operator[]((array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                          *)(in_RDI + 0x28),local_80);
            array<int,_allocator_default<int>_>::add
                      ((array<int,_allocator_default<int>_> *)in_stack_fffffffffffffec0,
                       (int *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          }
          else {
            array<int,_allocator_default<int>_>::array
                      ((array<int,_allocator_default<int>_> *)0x1e3947);
            array<int,_allocator_default<int>_>::add
                      ((array<int,_allocator_default<int>_> *)in_stack_fffffffffffffec0,
                       (int *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
            local_80 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                       ::add(in_stack_fffffffffffffec0,
                             (array<int,_allocator_default<int>_> *)
                             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
            bVar3 = true;
            array<int,_allocator_default<int>_>::~array
                      ((array<int,_allocator_default<int>_> *)in_stack_fffffffffffffec0);
          }
        }
        else {
          bVar3 = false;
        }
        iVar5 = (local_88 + 1) * *(int *)(lVar2 + 0x34) + local_8c;
        if ((*pcVar6 == '\x01') &&
           ((*(char *)(*(long *)(lVar2 + 0x68) + (long)iVar5 * 4) == '\0' ||
            (0xbf < *(byte *)(*(long *)(lVar2 + 0x68) + (long)iVar5 * 4))))) {
          if (bVar4) {
            array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
            ::operator[]((array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                          *)(in_RDI + 0x38),local_84);
            array<int,_allocator_default<int>_>::add
                      ((array<int,_allocator_default<int>_> *)in_stack_fffffffffffffec0,
                       (int *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          }
          else {
            array<int,_allocator_default<int>_>::array
                      ((array<int,_allocator_default<int>_> *)0x1e3ad0);
            array<int,_allocator_default<int>_>::add
                      ((array<int,_allocator_default<int>_> *)in_stack_fffffffffffffec0,
                       (int *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
            local_84 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                       ::add(in_stack_fffffffffffffec0,
                             (array<int,_allocator_default<int>_> *)
                             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
            bVar4 = true;
            array<int,_allocator_default<int>_>::~array
                      ((array<int,_allocator_default<int>_> *)in_stack_fffffffffffffec0);
          }
        }
        else {
          bVar4 = false;
        }
      }
    }
  }
  local_b4 = 0;
  local_b8 = 0;
  for (local_bc = 1; local_bc < *(int *)(lVar2 + 0x34) + -1; local_bc = local_bc + 1) {
    bVar3 = false;
    bVar4 = false;
    for (local_c0 = 1; local_c0 < *(int *)(lVar2 + 0x38) + -1; local_c0 = local_c0 + 1) {
      pcVar6 = (char *)(*(long *)(lVar2 + 0x68) +
                       (long)(local_c0 * *(int *)(lVar2 + 0x34) + local_bc) * 4);
      if (*pcVar6 == '\0') {
        bVar3 = false;
        bVar4 = false;
      }
      else {
        iVar5 = local_c0 * *(int *)(lVar2 + 0x34) + local_bc + 1;
        if ((*pcVar6 == '\x01') &&
           ((*(char *)(*(long *)(lVar2 + 0x68) + (long)iVar5 * 4) == '\0' ||
            (0xbf < *(byte *)(*(long *)(lVar2 + 0x68) + (long)iVar5 * 4))))) {
          if (bVar3) {
            array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
            ::operator[]((array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                          *)(in_RDI + 0x48),local_b4);
            array<int,_allocator_default<int>_>::add
                      ((array<int,_allocator_default<int>_> *)in_stack_fffffffffffffec0,
                       (int *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          }
          else {
            array<int,_allocator_default<int>_>::array
                      ((array<int,_allocator_default<int>_> *)0x1e3d65);
            array<int,_allocator_default<int>_>::add
                      ((array<int,_allocator_default<int>_> *)in_stack_fffffffffffffec0,
                       (int *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
            local_b4 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                       ::add(in_stack_fffffffffffffec0,
                             (array<int,_allocator_default<int>_> *)
                             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
            bVar3 = true;
            array<int,_allocator_default<int>_>::~array
                      ((array<int,_allocator_default<int>_> *)in_stack_fffffffffffffec0);
          }
        }
        else {
          bVar3 = false;
        }
        iVar5 = local_c0 * *(int *)(lVar2 + 0x34) + local_bc + -1;
        if ((*pcVar6 == '\x01') &&
           ((*(char *)(*(long *)(lVar2 + 0x68) + (long)iVar5 * 4) == '\0' ||
            (0xbf < *(byte *)(*(long *)(lVar2 + 0x68) + (long)iVar5 * 4))))) {
          if (bVar4) {
            array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
            ::operator[]((array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                          *)(in_RDI + 0x58),local_b8);
            array<int,_allocator_default<int>_>::add
                      ((array<int,_allocator_default<int>_> *)in_stack_fffffffffffffec0,
                       (int *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          }
          else {
            array<int,_allocator_default<int>_>::array
                      ((array<int,_allocator_default<int>_> *)0x1e3ee7);
            array<int,_allocator_default<int>_>::add
                      ((array<int,_allocator_default<int>_> *)in_stack_fffffffffffffec0,
                       (int *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
            local_b8 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                       ::add(in_stack_fffffffffffffec0,
                             (array<int,_allocator_default<int>_> *)
                             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
            bVar4 = true;
            array<int,_allocator_default<int>_>::~array
                      ((array<int,_allocator_default<int>_> *)in_stack_fffffffffffffec0);
          }
        }
        else {
          bVar4 = false;
        }
      }
    }
  }
  for (local_d0 = 0;
      iVar5 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
              ::size((array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                      *)(in_RDI + 0x28)), local_d0 < iVar5; local_d0 = local_d0 + 1) {
    paVar7 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
             ::operator[]((array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                           *)(in_RDI + 0x28),local_d0);
    iVar5 = array<int,_allocator_default<int>_>::size(paVar7);
    if (iVar5 < 3) {
      array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
      ::remove_index_fast(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
      local_d0 = local_d0 + -1;
    }
  }
  for (local_d4 = 0;
      iVar5 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
              ::size((array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                      *)(in_RDI + 0x38)), local_d4 < iVar5; local_d4 = local_d4 + 1) {
    paVar7 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
             ::operator[]((array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                           *)(in_RDI + 0x38),local_d4);
    iVar5 = array<int,_allocator_default<int>_>::size(paVar7);
    if (iVar5 < 3) {
      array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
      ::remove_index_fast(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
      local_d4 = local_d4 + -1;
    }
  }
  for (local_d8 = 0;
      iVar5 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
              ::size((array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                      *)(in_RDI + 0x48)), local_d8 < iVar5; local_d8 = local_d8 + 1) {
    paVar7 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
             ::operator[]((array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                           *)(in_RDI + 0x48),local_d8);
    iVar5 = array<int,_allocator_default<int>_>::size(paVar7);
    if (iVar5 < 3) {
      array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
      ::remove_index_fast(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
      local_d8 = local_d8 + -1;
    }
  }
  for (local_dc = 0;
      iVar5 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
              ::size((array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                      *)(in_RDI + 0x58)), local_dc < iVar5; local_dc = local_dc + 1) {
    paVar7 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
             ::operator[]((array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                           *)(in_RDI + 0x58),local_dc);
    iVar5 = array<int,_allocator_default<int>_>::size(paVar7);
    if (iVar5 < 3) {
      array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
      ::remove_index_fast(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
      local_dc = local_dc + -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CDoodadsMapper::AnalyzeGameLayer()
{
	// the purpose of this is to detect game layer collision's edges to place doodads according to them

	// clear existing edges
	m_FloorIDs.clear();
	m_CeilingIDs.clear();
	m_RightWallIDs.clear();
	m_LeftWallIDs.clear();

	CLayerGame *pLayer = m_pEditor->m_Map.m_pGameLayer;

	bool FloorKeepChaining = false;
	bool CeilingKeepChaining = false;
	int FloorChainID = 0;
	int CeilingChainID = 0;

	// floors and ceilings
	// browse up to down
	for(int y = 1; y < pLayer->m_Height-1; y++)
	{
		FloorKeepChaining = false;
		CeilingKeepChaining = false;

		for(int x = 1; x < pLayer->m_Width-1; x++)
		{
			CTile *pTile = &(pLayer->m_pTiles[y*pLayer->m_Width+x]);

			// empty, skip
			if(pTile->m_Index == 0)
			{
				FloorKeepChaining = false;
				CeilingKeepChaining = false;
				continue;
			}

			// check up
			int CheckIndex = (y-1)*pLayer->m_Width+x;

			// add a floor part
			if(pTile->m_Index == 1 && (pLayer->m_pTiles[CheckIndex].m_Index == 0 || pLayer->m_pTiles[CheckIndex].m_Index > ENTITY_OFFSET))
			{
				// create an new chain
				if(!FloorKeepChaining)
				{
					array<int> aChain;
					aChain.add(y*pLayer->m_Width+x);
					FloorChainID = m_FloorIDs.add(aChain);
					FloorKeepChaining = true;
				}
				else
				{
					// keep chaining
					m_FloorIDs[FloorChainID].add(y*pLayer->m_Width+x);
				}
			}
			else
				FloorKeepChaining = false;

			// check down
			CheckIndex = (y+1)*pLayer->m_Width+x;

			// add a ceiling part
			if(pTile->m_Index == 1 && (pLayer->m_pTiles[CheckIndex].m_Index == 0 || pLayer->m_pTiles[CheckIndex].m_Index > ENTITY_OFFSET))
			{
				// create an new chain
				if(!CeilingKeepChaining)
				{
					array<int> aChain;
					aChain.add(y*pLayer->m_Width+x);
					CeilingChainID = m_CeilingIDs.add(aChain);
					CeilingKeepChaining = true;
				}
				else
				{
					// keep chaining
					m_CeilingIDs[CeilingChainID].add(y*pLayer->m_Width+x);
				}
			}
			else
				CeilingKeepChaining = false;
		}
	}

	bool RWallKeepChaining = false;
	bool LWallKeepChaining = false;
	int RWallChainID = 0;
	int LWallChainID = 0;

	// walls
	// browse left to right
	for(int x = 1; x < pLayer->m_Width-1; x++)
	{
		RWallKeepChaining = false;
		LWallKeepChaining = false;

		for(int y = 1; y < pLayer->m_Height-1; y++)
		{
			CTile *pTile = &(pLayer->m_pTiles[y*pLayer->m_Width+x]);

			if(pTile->m_Index == 0)
			{
				RWallKeepChaining = false;
				LWallKeepChaining = false;
				continue;
			}

			// check right
			int CheckIndex = y*pLayer->m_Width+(x+1);

			// add a right wall part
			if(pTile->m_Index == 1 && (pLayer->m_pTiles[CheckIndex].m_Index == 0 || pLayer->m_pTiles[CheckIndex].m_Index > ENTITY_OFFSET))
			{
				// create an new chain
				if(!RWallKeepChaining)
				{
					array<int> aChain;
					aChain.add(y*pLayer->m_Width+x);
					RWallChainID = m_RightWallIDs.add(aChain);
					RWallKeepChaining = true;
				}
				else
				{
					// keep chaining
					m_RightWallIDs[RWallChainID].add(y*pLayer->m_Width+x);
				}
			}
			else
				RWallKeepChaining = false;

			// check left
			CheckIndex = y*pLayer->m_Width+(x-1);

			// add a left wall part
			if(pTile->m_Index == 1 && (pLayer->m_pTiles[CheckIndex].m_Index == 0 || pLayer->m_pTiles[CheckIndex].m_Index > ENTITY_OFFSET))
			{
				// create an new chain
				if(!LWallKeepChaining)
				{
					array<int> aChain;
					aChain.add(y*pLayer->m_Width+x);
					LWallChainID = m_LeftWallIDs.add(aChain);
					LWallKeepChaining = true;
				}
				else
				{
					// keep chaining
					m_LeftWallIDs[LWallChainID].add(y*pLayer->m_Width+x);
				}
			}
			else
				LWallKeepChaining = false;
		}
	}

	// clean up too small chains
	for(int i = 0; i < m_FloorIDs.size(); i++)
	{
		if(m_FloorIDs[i].size() < 3)
		{
			m_FloorIDs.remove_index_fast(i);
			i--;
		}
	}

	for(int i = 0; i < m_CeilingIDs.size(); i++)
	{
		if(m_CeilingIDs[i].size() < 3)
		{
			m_CeilingIDs.remove_index_fast(i);
			i--;
		}
	}

	for(int i = 0; i < m_RightWallIDs.size(); i++)
	{
		if(m_RightWallIDs[i].size() < 3)
		{
			m_RightWallIDs.remove_index_fast(i);
			i--;
		}
	}

	for(int i = 0; i < m_LeftWallIDs.size(); i++)
	{
		if(m_LeftWallIDs[i].size() < 3)
		{
			m_LeftWallIDs.remove_index_fast(i);
			i--;
		}
	}
}